

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

string * __thiscall
EqualNode::Evaluate(string *__return_storage_ptr__,EqualNode *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *parameters,cmGeneratorExpressionContext *context,
                   GeneratorExpressionContent *content,cmGeneratorExpressionDAGChecker *param_4)

{
  char cVar1;
  long lVar2;
  int *piVar3;
  long *plVar4;
  size_type *psVar5;
  long lVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  bool bVar11;
  char *pEnd;
  string local_b0;
  cmGeneratorExpressionContext *local_90;
  GeneratorExpressionContent *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  int *local_40;
  char *local_38;
  
  pcVar9 = (((parameters->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  cVar1 = *pcVar9;
  iVar7 = 0;
  if (cVar1 == '0') {
    if ((pcVar9[1] == 'b') || (bVar11 = false, pcVar9[1] == 'B')) {
      cVar1 = pcVar9[2];
      pcVar9 = pcVar9 + 2;
      iVar7 = 2;
      goto LAB_0040fe99;
    }
    iVar7 = 0;
  }
  else {
LAB_0040fe99:
    bVar11 = cVar1 == '-';
    if (bVar11) {
      if (((pcVar9[1] != '0') || (pcVar9[2] != 'b')) && ((pcVar9[1] != '0' || (pcVar9[2] != 'B'))))
      {
        bVar11 = false;
        goto LAB_0040fefc;
      }
      cVar1 = pcVar9[3];
      pcVar9 = pcVar9 + 3;
      iVar7 = 2;
    }
    if ((cVar1 == '+') &&
       (((pcVar9[1] == '0' && (pcVar9[2] == 'b')) || ((pcVar9[1] == '0' && (pcVar9[2] == 'B')))))) {
      pcVar9 = pcVar9 + 3;
      iVar7 = 2;
    }
  }
LAB_0040fefc:
  local_90 = context;
  local_88 = content;
  lVar2 = strtol(pcVar9,&local_38,iVar7);
  if (((local_38 == pcVar9) || (*local_38 != '\0')) ||
     (piVar3 = __errno_location(), *piVar3 == 0x22)) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_60,local_88);
    std::operator+(&local_80,"$<EQUAL> parameter ",
                   (parameters->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_b0.field_2._M_allocated_capacity = *psVar5;
      local_b0.field_2._8_8_ = plVar4[3];
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar5;
      local_b0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_b0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    reportError(local_90,&local_60,&local_b0);
    goto LAB_0040ffba;
  }
  lVar10 = -lVar2;
  if (!bVar11) {
    lVar10 = lVar2;
  }
  pcVar9 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
  cVar1 = *pcVar9;
  iVar7 = 0;
  if (cVar1 == '0') {
    if ((pcVar9[1] == 'b') || (bVar11 = false, pcVar9[1] == 'B')) {
      cVar1 = pcVar9[2];
      pcVar9 = pcVar9 + 2;
      iVar7 = 2;
      goto LAB_0041006c;
    }
    iVar7 = 0;
  }
  else {
LAB_0041006c:
    bVar11 = cVar1 == '-';
    if (bVar11) {
      if (((pcVar9[1] != '0') || (pcVar9[2] != 'b')) && ((pcVar9[1] != '0' || (pcVar9[2] != 'B'))))
      {
        bVar11 = false;
        goto LAB_004100c6;
      }
      cVar1 = pcVar9[3];
      pcVar9 = pcVar9 + 3;
      iVar7 = 2;
    }
    if ((cVar1 == '+') &&
       (((pcVar9[1] == '0' && (pcVar9[2] == 'b')) || ((pcVar9[1] == '0' && (pcVar9[2] == 'B')))))) {
      pcVar9 = pcVar9 + 3;
      iVar7 = 2;
    }
  }
LAB_004100c6:
  local_40 = piVar3;
  lVar2 = strtol(pcVar9,&local_38,iVar7);
  if (((local_38 != pcVar9) && (*local_38 == '\0')) && (*local_40 != 0x22)) {
    lVar6 = -lVar2;
    if (!bVar11) {
      lVar6 = lVar2;
    }
    pcVar9 = "0";
    if (lVar10 == lVar6) {
      pcVar9 = "1";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "";
    if (lVar10 == lVar6) {
      pcVar8 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar9,pcVar8);
    return __return_storage_ptr__;
  }
  GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_60,local_88);
  std::operator+(&local_80,"$<EQUAL> parameter ",
                 (parameters->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_b0.field_2._M_allocated_capacity = *psVar5;
    local_b0.field_2._8_8_ = plVar4[3];
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar5;
    local_b0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_b0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  reportError(local_90,&local_60,&local_b0);
LAB_0040ffba:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    char* pEnd;

    int base = 0;
    bool flipSign = false;

    const char* lhs = parameters[0].c_str();
    if (cmHasLiteralPrefix(lhs, "0b") || cmHasLiteralPrefix(lhs, "0B")) {
      base = 2;
      lhs += 2;
    }
    if (cmHasLiteralPrefix(lhs, "-0b") || cmHasLiteralPrefix(lhs, "-0B")) {
      base = 2;
      lhs += 3;
      flipSign = true;
    }
    if (cmHasLiteralPrefix(lhs, "+0b") || cmHasLiteralPrefix(lhs, "+0B")) {
      base = 2;
      lhs += 3;
    }

    long lnum = strtol(lhs, &pEnd, base);
    if (pEnd == lhs || *pEnd != '\0' || errno == ERANGE) {
      reportError(context, content->GetOriginalExpression(),
                  "$<EQUAL> parameter " + parameters[0] +
                    " is not a valid integer.");
      return std::string();
    }

    if (flipSign) {
      lnum = -lnum;
    }

    base = 0;
    flipSign = false;

    const char* rhs = parameters[1].c_str();
    if (cmHasLiteralPrefix(rhs, "0b") || cmHasLiteralPrefix(rhs, "0B")) {
      base = 2;
      rhs += 2;
    }
    if (cmHasLiteralPrefix(rhs, "-0b") || cmHasLiteralPrefix(rhs, "-0B")) {
      base = 2;
      rhs += 3;
      flipSign = true;
    }
    if (cmHasLiteralPrefix(rhs, "+0b") || cmHasLiteralPrefix(rhs, "+0B")) {
      base = 2;
      rhs += 3;
    }

    long rnum = strtol(rhs, &pEnd, base);
    if (pEnd == rhs || *pEnd != '\0' || errno == ERANGE) {
      reportError(context, content->GetOriginalExpression(),
                  "$<EQUAL> parameter " + parameters[1] +
                    " is not a valid integer.");
      return std::string();
    }

    if (flipSign) {
      rnum = -rnum;
    }

    return lnum == rnum ? "1" : "0";
  }